

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

FString SubstituteAliasParams(FString *command,FCommandLine *args)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *in_RDX;
  bool bVar4;
  bool local_79;
  bool local_3a;
  int iStack_38;
  bool inquote;
  unsigned_long argnum;
  char *start;
  char *p;
  FCommandLine *args_local;
  FString *command_local;
  FString *buf;
  
  p = in_RDX;
  args_local = args;
  command_local = command;
  argnum = (unsigned_long)FString::LockBuffer((FString *)args);
  start = (char *)argnum;
  FString::FString(command);
  local_3a = false;
  while (*start != '\0') {
    if ((*start == '%') && ((('/' < start[1] && (start[1] < ':')) || (start[1] == '{')))) {
      FString::AppendCStrPart(command,(char *)argnum,(long)start - argnum);
      uVar2 = strtoul(start + (long)(int)(uint)(start[1] == '{') + 1,(char **)&argnum,10);
      if (((start[1] != '{') || (*(char *)argnum == '}')) &&
         (iVar1 = FCommandLine::argc((FCommandLine *)p), uVar2 < (ulong)(long)iVar1)) {
        iStack_38 = (int)uVar2;
        pcVar3 = FCommandLine::operator[]((FCommandLine *)p,iStack_38);
        FString::operator+=(command,pcVar3);
      }
      local_79 = false;
      if (start[1] == '{') {
        local_79 = *(char *)argnum == '}';
      }
      argnum = argnum + (long)(int)(uint)local_79;
      start = (char *)argnum;
    }
    else if ((*start == '%') && (start[1] == '%')) {
      FString::AppendCStrPart(command,(char *)argnum,(size_t)(start + (1 - argnum)));
      argnum = (unsigned_long)(start + 2);
      start = (char *)argnum;
    }
    else if ((*start == '%') && (start[1] == '\"')) {
      if (!local_3a) {
        FString::AppendCStrPart(command,(char *)argnum,(long)start - argnum);
        argnum = (unsigned_long)(start + 1);
      }
      local_3a = !local_3a;
      start = start + 2;
    }
    else if ((*start == '\\') && (start[1] == '\"')) {
      start = start + 2;
    }
    else if (*start == '\"') {
      if (local_3a) {
        local_3a = false;
        start = start + 1;
      }
      else {
        do {
          pcVar3 = start;
          start = pcVar3 + 1;
          bVar4 = false;
          if ((*start != '\0') && (bVar4 = true, *start == '\"')) {
            bVar4 = *pcVar3 == '\\';
          }
        } while (bVar4);
        if (*start != '\0') {
          start = pcVar3 + 2;
        }
      }
    }
    else {
      start = start + 1;
    }
  }
  if (argnum < start) {
    FString::AppendCStrPart(command,(char *)argnum,(long)start - argnum);
  }
  FString::UnlockBuffer((FString *)args_local);
  return (FString)(char *)command;
}

Assistant:

FString SubstituteAliasParams (FString &command, FCommandLine &args)
{
	// Do substitution by replacing %x with the argument x.
	// If there is no argument x, then %x is simply removed.

	// For some reason, strtoul's stop parameter is non-const.
	char *p = command.LockBuffer(), *start = p;
	unsigned long argnum;
	FString buf;
	bool inquote = false;

	while (*p != '\0')
	{
		if (p[0] == '%' && ((p[1] >= '0' && p[1] <= '9') || p[1] == '{'))
		{
			// Do a substitution. Output what came before this.
			buf.AppendCStrPart (start, p - start);

			// Extract the argument number and substitute the corresponding argument.
			argnum = strtoul (p + 1 + (p[1] == '{'), &start, 10);
			if ((p[1] != '{' || *start == '}') && argnum < (unsigned long)args.argc())
			{
				buf += args[argnum];
			}
			p = (start += (p[1] == '{' && *start == '}'));
		}
		else if (p[0] == '%' && p[1] == '%')
		{
			// Do not substitute. Just collapse to a single %.
			buf.AppendCStrPart (start, p - start + 1);
			start = p = p + 2;
			continue;
		}
		else if (p[0] == '%' && p[1] == '"')
		{
			// Collapse %" to " and remember that we're in a quote so when we
			// see a " character again, we don't start skipping below.
			if (!inquote)
			{
				inquote = true;
				buf.AppendCStrPart(start, p - start);
				start = p + 1;
			}
			else
			{
				inquote = false;
			}
			p += 2;
		}
		else if (p[0] == '\\' && p[1] == '"')
		{
			p += 2;
		}
		else if (p[0] == '"')
		{
			// Don't substitute inside quoted strings if it didn't start
			// with a %"
			if (!inquote)
			{
				p++;
				while (*p != '\0' && (*p != '"' || *(p-1) == '\\'))
					p++;
				if (*p != '\0')
					p++;
			}
			else
			{
				inquote = false;
				p++;
			}
		}
		else
		{
			p++;
		}
	}
	// Return whatever was after the final substitution.
	if (p > start)
	{
		buf.AppendCStrPart (start, p - start);
	}
	command.UnlockBuffer();

	return buf;
}